

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroup
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlSchemaTypeType type,
          int withParticle)

{
  xmlSchemaRedefPtr_conflict pxVar1;
  _xmlNode *localName;
  _xmlNode *namespaceName;
  uint uVar2;
  uint uVar3;
  int iVar4;
  xmlSchemaParticlePtr pxVar5;
  xmlAttrPtr pxVar6;
  xmlSchemaAnnotPtr pxVar7;
  xmlSchemaTreeItemPtr_conflict pxVar8;
  xmlSchemaTreeItemPtr *ppxVar9;
  _xmlNode *p_Var10;
  xmlSchemaPtr schema_00;
  bool bVar11;
  int *isElemRef_00;
  _xmlNode *node_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr pxVar12;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  _xmlNode *node_01;
  int def;
  char *in_R9;
  char *pcVar13;
  xmlSchemaTreeItemPtr_conflict *ppxVar14;
  xmlSchemaTreeItemPtr_conflict pxVar15;
  _xmlAttr *p_Var16;
  xmlChar *str;
  int isElemRef;
  char *in_stack_ffffffffffffff58;
  int local_84;
  xmlChar *local_78;
  uint local_70;
  int local_6c;
  xmlSchemaAnnotPtr local_68;
  xmlNodePtr local_60;
  uint local_54;
  xmlSchemaParticlePtr local_50;
  xmlSchemaTreeItemPtr_conflict *local_48;
  xmlSchemaParticlePtr local_40;
  _xmlNode *local_38;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  node_00 = node;
  iVar4 = withParticle;
  pxVar5 = (xmlSchemaParticlePtr)xmlSchemaAddModelGroup(ctxt,schema,type,node);
  if (pxVar5 == (xmlSchemaParticlePtr)0x0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  local_40 = pxVar5;
  if (withParticle == 0) {
    p_Var16 = node->properties;
    local_54 = 1;
    if (p_Var16 == (_xmlAttr *)0x0) {
      local_70 = 1;
      local_50 = pxVar5;
    }
    else {
      do {
        if (p_Var16->ns == (xmlNs *)0x0) {
          iVar4 = xmlStrEqual(p_Var16->name,"id");
          pxVar12 = extraout_RDX_00;
          if (iVar4 == 0) goto LAB_00198c3a;
        }
        else {
          iVar4 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar12 = extraout_RDX;
          if (iVar4 != 0) {
LAB_00198c3a:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var16,pxVar12,(xmlAttrPtr)node_00);
          }
        }
        p_Var16 = p_Var16->next;
      } while (p_Var16 != (_xmlAttr *)0x0);
      local_50 = local_40;
      local_70 = 1;
      pxVar5 = local_40;
    }
  }
  else {
    if (type != XML_SCHEMA_TYPE_ALL) {
      uVar2 = xmlGetMinOccurs(ctxt,node,-1,0x1e3923,iVar4,in_R9);
      def = 0x1e3939;
      iVar4 = 0x40000000;
    }
    else {
      uVar2 = xmlGetMinOccurs(ctxt,node,1,0x1e391b,iVar4,in_R9);
      def = 0x1cb69a;
      iVar4 = 1;
    }
    uVar3 = xmlGetMaxOccurs(ctxt,node,(uint)(type == XML_SCHEMA_TYPE_ALL),iVar4,def,in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar2,uVar3,def);
    node_00 = (_xmlNode *)(ulong)uVar3;
    local_50 = xmlSchemaAddParticle(ctxt,node,uVar2,uVar3);
    if (local_50 == (xmlSchemaParticlePtr)0x0) {
      return (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    local_50->children = (xmlSchemaTreeItemPtr_conflict)pxVar5;
    local_70 = uVar3;
    local_54 = uVar2;
    for (p_Var16 = node->properties; p_Var16 != (_xmlAttr *)0x0; p_Var16 = p_Var16->next) {
      local_60 = node;
      if (p_Var16->ns == (xmlNs *)0x0) {
        iVar4 = xmlStrEqual(p_Var16->name,"id");
        if (((iVar4 == 0) && (iVar4 = xmlStrEqual(p_Var16->name,(xmlChar *)"maxOccurs"), iVar4 == 0)
            ) && (iVar4 = xmlStrEqual(p_Var16->name,(xmlChar *)"minOccurs"),
                 pxVar12 = extraout_RDX_02, iVar4 == 0)) goto LAB_00198d14;
      }
      else {
        iVar4 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar12 = extraout_RDX_01;
        if (iVar4 != 0) {
LAB_00198d14:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var16,pxVar12,(xmlAttrPtr)node_00);
        }
      }
      node = local_60;
      pxVar5 = local_40;
    }
  }
  pxVar6 = xmlSchemaGetPropNode(node,"id");
  if (pxVar6 != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(ctxt,pxVar6);
  }
  node_01 = node->children;
  if (node_01 == (xmlNodePtr)0x0) {
    node_01 = (xmlNodePtr)0x0;
  }
  else if (((node_01->ns != (xmlNs *)0x0) &&
           (iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"annotation"), iVar4 != 0)) &&
          (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
          iVar4 != 0)) {
    pxVar7 = xmlSchemaParseAnnotation(ctxt,node_01,1);
    pxVar5->annot = pxVar7;
    node_01 = node_01->next;
  }
  if (type == XML_SCHEMA_TYPE_ALL) {
    if (node_01 != (xmlNodePtr)0x0) {
      pxVar15 = (xmlSchemaTreeItemPtr_conflict)0x0;
      local_84 = 0;
      local_60 = node;
      do {
        if (((node_01->ns == (xmlNs *)0x0) ||
            (iVar4 = xmlStrEqual(node_01->name,"element"), iVar4 == 0)) ||
           (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar4 == 0)) {
          pcVar13 = "(annotation?, (annotation?, element*)";
LAB_001995b7:
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)local_60,node_01,
                     (xmlNodePtr)0x0,pcVar13,in_stack_ffffffffffffff58);
          break;
        }
        pxVar8 = (xmlSchemaTreeItemPtr_conflict)
                 xmlSchemaParseElement(ctxt,schema,node_01,&local_6c,0);
        if (pxVar8 != (xmlSchemaTreeItemPtr_conflict)0x0) {
          local_84 = (local_84 + 1) - (uint)(local_6c == 0);
          if (1 < (int)pxVar8[1].type) {
            in_stack_ffffffffffffff58 = (char *)0x0;
            xmlSchemaPCustomErrExt
                      (ctxt,XML_SCHEMAP_COS_ALL_LIMITED,(xmlSchemaBasicItemPtr)0x0,node_01,
                       "Invalid value for minOccurs (must be 0 or 1)",(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)0x0);
            pxVar8[1].type = XML_SCHEMA_TYPE_BASIC;
          }
          if (1 < *(int *)&pxVar8[1].field_0x4) {
            in_stack_ffffffffffffff58 = (char *)0x0;
            xmlSchemaPCustomErrExt
                      (ctxt,XML_SCHEMAP_COS_ALL_LIMITED,(xmlSchemaBasicItemPtr)0x0,node_01,
                       "Invalid value for maxOccurs (must be 0 or 1)",(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)0x0);
            *(undefined4 *)&pxVar8[1].field_0x4 = 1;
          }
          ppxVar9 = &pxVar15->next;
          if (pxVar15 == (xmlSchemaTreeItemPtr_conflict)0x0) {
            ppxVar9 = &pxVar5->children;
          }
          *ppxVar9 = pxVar8;
          pxVar15 = pxVar8;
        }
        node_01 = node_01->next;
      } while (node_01 != (_xmlNode *)0x0);
      goto LAB_001995cf;
    }
  }
  else if (node_01 != (xmlNodePtr)0x0) {
    ppxVar14 = &pxVar5->children;
    local_38 = (_xmlNode *)0x0;
    p_Var10 = (_xmlNode *)0x0;
    local_84 = 0;
    local_60 = node;
    local_48 = ppxVar14;
    do {
      if ((((((node_01->ns == (xmlNs *)0x0) ||
             (iVar4 = xmlStrEqual(node_01->name,"element"), iVar4 == 0)) ||
            (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
            iVar4 == 0)) &&
           (((node_01->ns == (xmlNs *)0x0 ||
             (iVar4 = xmlStrEqual(node_01->name,"group"), iVar4 == 0)) ||
            (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
            iVar4 == 0)))) &&
          (((node_01->ns == (xmlNs *)0x0 || (iVar4 = xmlStrEqual(node_01->name,"any"), iVar4 == 0))
           || (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar4 == 0)))) &&
         ((((node_01->ns == (xmlNs *)0x0 ||
            (iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"choice"), iVar4 == 0)) ||
           (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar4 == 0)) &&
          (((node_01->ns == (xmlNs *)0x0 ||
            (iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"sequence"), iVar4 == 0)) ||
           (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar4 == 0)))))) {
        pcVar13 = "(annotation?, (element | group | choice | sequence | any)*)";
        goto LAB_001995b7;
      }
      if (((node_01->ns != (xmlNs *)0x0) &&
          (iVar4 = xmlStrEqual(node_01->name,"element"), iVar4 != 0)) &&
         (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar4 != 0)) {
        isElemRef_00 = &local_6c;
        p_Var10 = (_xmlNode *)xmlSchemaParseElement(ctxt,schema,node_01,isElemRef_00,0);
        bVar11 = local_6c != 0 && p_Var10 != (_xmlNode *)0x0;
        node_00 = (_xmlNode *)CONCAT71((int7)((ulong)isElemRef_00 >> 8),bVar11);
        local_84 = local_84 + (uint)bVar11;
        goto LAB_001994ea;
      }
      if (((node_01->ns == (xmlNs *)0x0) || (iVar4 = xmlStrEqual(node_01->name,"group"), iVar4 == 0)
          ) || (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 == 0)) {
        if (((node_01->ns == (xmlNs *)0x0) || (iVar4 = xmlStrEqual(node_01->name,"any"), iVar4 == 0)
            ) || (iVar4 = xmlStrEqual(node_01->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0)) {
          if (((node_01->ns == (xmlNs *)0x0) ||
              (iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"choice"), iVar4 == 0)) ||
             (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar4 == 0)) {
            if (((node_01->ns == (xmlNs *)0x0) ||
                (iVar4 = xmlStrEqual(node_01->name,(xmlChar *)"sequence"), iVar4 == 0)) ||
               (iVar4 = xmlStrEqual(node_01->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar4 == 0)) goto LAB_001994ea;
            node_00 = (_xmlNode *)0x6;
          }
          else {
            node_00 = (_xmlNode *)0x7;
          }
          p_Var10 = (_xmlNode *)
                    xmlSchemaParseModelGroup(ctxt,schema,node_01,(xmlSchemaTypeType)node_00,1);
        }
        else {
          for (p_Var16 = node_01->properties; p_Var16 != (_xmlAttr *)0x0; p_Var16 = p_Var16->next) {
            if (p_Var16->ns == (xmlNs *)0x0) {
              iVar4 = xmlStrEqual(p_Var16->name,"id");
              if ((((iVar4 == 0) &&
                   (iVar4 = xmlStrEqual(p_Var16->name,(xmlChar *)"minOccurs"), iVar4 == 0)) &&
                  (iVar4 = xmlStrEqual(p_Var16->name,(xmlChar *)"maxOccurs"), iVar4 == 0)) &&
                 ((iVar4 = xmlStrEqual(p_Var16->name,"namespace"), iVar4 == 0 &&
                  (iVar4 = xmlStrEqual(p_Var16->name,(xmlChar *)"processContents"),
                  pxVar12 = extraout_RDX_04, iVar4 == 0)))) goto LAB_0019923d;
            }
            else {
              iVar4 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar12 = extraout_RDX_03;
              if (iVar4 != 0) {
LAB_0019923d:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var16,pxVar12,(xmlAttrPtr)node_00);
              }
            }
          }
          pxVar6 = xmlSchemaGetPropNode(node_01,"id");
          if (pxVar6 != (xmlAttrPtr)0x0) {
            xmlSchemaPValAttrNodeID(ctxt,pxVar6);
          }
          iVar4 = 0x1e3939;
          uVar2 = xmlGetMaxOccurs(ctxt,node_01,0,0x40000000,0x1e3939,in_R9);
          uVar3 = xmlGetMinOccurs(ctxt,node_01,-1,0x1e3923,iVar4,in_R9);
          xmlSchemaPCheckParticleCorrect_2
                    (ctxt,(xmlSchemaParticlePtr)node_01,(xmlNodePtr)(ulong)uVar3,uVar2,iVar4);
          node_00 = node_01;
          schema_00 = (xmlSchemaPtr)xmlSchemaAddWildcard(ctxt,schema,XML_SCHEMA_TYPE_ANY,node_01);
          if (schema_00 == (xmlSchemaPtr)0x0) {
            p_Var10 = (_xmlNode *)0x0;
            ppxVar14 = local_48;
          }
          else {
            xmlSchemaParseWildcardNs(ctxt,schema_00,(xmlSchemaWildcardPtr)node_01,node_00);
            p_Var10 = node_01->children;
            if (p_Var10 == (xmlNodePtr)0x0) {
              p_Var10 = (xmlNodePtr)0x0;
LAB_00199465:
              local_68 = (xmlSchemaAnnotPtr)0x0;
            }
            else {
              if (((p_Var10->ns == (xmlNs *)0x0) ||
                  (iVar4 = xmlStrEqual(p_Var10->name,(xmlChar *)"annotation"), iVar4 == 0)) ||
                 (iVar4 = xmlStrEqual(p_Var10->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar4 == 0))
              goto LAB_00199465;
              local_68 = xmlSchemaParseAnnotation(ctxt,p_Var10,1);
              p_Var10 = p_Var10->next;
            }
            if (p_Var10 != (xmlNodePtr)0x0) {
              in_R9 = "(annotation?)";
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node_01,
                         p_Var10,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff58);
              node_00 = p_Var10;
            }
            if (uVar3 == 0 && uVar2 == 0) {
              p_Var10 = (_xmlNode *)0x0;
              ppxVar14 = local_48;
            }
            else {
              node_00 = (_xmlNode *)(ulong)uVar2;
              p_Var10 = (_xmlNode *)xmlSchemaAddParticle(ctxt,node_01,uVar3,uVar2);
              ppxVar14 = local_48;
              if (p_Var10 == (_xmlNode *)0x0) {
                p_Var10 = (_xmlNode *)0x0;
              }
              else {
                *(xmlSchemaAnnotPtr *)&p_Var10->type = local_68;
                p_Var10->children = (_xmlNode *)schema_00;
              }
            }
          }
        }
      }
      else {
        p_Var10 = (_xmlNode *)xmlSchemaParseModelGroupDefRef(ctxt,schema,node_01);
        local_84 = (local_84 + 1) - (uint)(p_Var10 == (_xmlNode *)0x0);
        if ((((ctxt->isRedefine == 0) ||
             (pxVar1 = ctxt->redef, pxVar1 == (xmlSchemaRedefPtr_conflict)0x0)) ||
            (p_Var10 == (_xmlNode *)0x0)) ||
           (((node_00 = (_xmlNode *)pxVar1->item,
             *(xmlSchemaTypeType *)&node_00->_private != XML_SCHEMA_TYPE_GROUP ||
             (node_00 = p_Var10->children, node_00 == (_xmlNode *)0x0)) ||
            ((localName = (_xmlNode *)pxVar1->refName, node_00->children != localName ||
             (namespaceName = (_xmlNode *)pxVar1->refTargetNs, node_00->last != namespaceName))))))
        goto LAB_001994ea;
        if (ctxt->redefCounter == 0) {
          if ((*(int *)&p_Var10->last != 1) || (*(int *)((long)&p_Var10->last + 4) != 1)) {
            local_78 = (xmlChar *)0x0;
            in_R9 = (char *)xmlSchemaFormatQName
                                      (&local_78,(xmlChar *)namespaceName,(xmlChar *)localName);
            pcVar13 = 
            "The redefining model group definition \'%s\' must not contain a reference to the redefined definition with a maxOccurs/minOccurs other than 1"
            ;
            goto LAB_00199559;
          }
        }
        else {
          local_78 = (xmlChar *)0x0;
          in_R9 = (char *)xmlSchemaFormatQName
                                    (&local_78,(xmlChar *)namespaceName,(xmlChar *)localName);
          pcVar13 = 
          "The redefining model group definition \'%s\' must not contain more than one reference to the redefined definition"
          ;
LAB_00199559:
          in_stack_ffffffffffffff58 = (char *)0x0;
          node_00 = (_xmlNode *)0x0;
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_REDEFINE,node_01,
                              (xmlSchemaBasicItemPtr)0x0,pcVar13,(xmlChar *)in_R9,(xmlChar *)0x0,
                              (xmlChar *)0x0,(xmlChar *)0x0);
          if (local_78 != (xmlChar *)0x0) {
            (*xmlFree)(local_78);
            local_78 = (xmlChar *)0x0;
          }
          p_Var10 = (_xmlNode *)0x0;
        }
        ctxt->redef->reference = (xmlSchemaBasicItemPtr)p_Var10;
        ctxt->redefCounter = ctxt->redefCounter + 1;
      }
LAB_001994ea:
      if (p_Var10 != (_xmlNode *)0x0) {
        ppxVar9 = (xmlSchemaTreeItemPtr *)&local_38->name;
        if (local_38 == (_xmlNode *)0x0) {
          ppxVar9 = ppxVar14;
        }
        *ppxVar9 = (xmlSchemaTreeItemPtr)p_Var10;
        node_00 = local_38;
        local_38 = p_Var10;
      }
      node_01 = node_01->next;
    } while (node_01 != (_xmlNode *)0x0);
    goto LAB_001995cf;
  }
  local_84 = 0;
LAB_001995cf:
  if (local_70 == 0 && local_54 == 0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  if (local_84 != 0) {
    iVar4 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,local_40);
    pxVar5 = local_50;
    if (iVar4 < 0) {
      xmlSchemaPErrMemory(ctxt);
      return (xmlSchemaTreeItemPtr_conflict)pxVar5;
    }
    return (xmlSchemaTreeItemPtr_conflict)local_50;
  }
  return (xmlSchemaTreeItemPtr_conflict)local_50;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroup(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
			 xmlNodePtr node, xmlSchemaTypeType type,
			 int withParticle)
{
    xmlSchemaModelGroupPtr item;
    xmlSchemaParticlePtr particle = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int min = 1, max = 1, isElemRef, hasRefs = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /*
    * Create a model group with the given compositor.
    */
    item = xmlSchemaAddModelGroup(ctxt, schema, type, node);
    if (item == NULL)
	return (NULL);

    if (withParticle) {
	if (type == XML_SCHEMA_TYPE_ALL) {
	    min = xmlGetMinOccurs(ctxt, node, 0, 1, 1, "(0 | 1)");
	    max = xmlGetMaxOccurs(ctxt, node, 1, 1, 1, "1");
	} else {
	    /* choice + sequence */
	    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
	    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
		"(xs:nonNegativeInteger | unbounded)");
	}
	xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
	/*
	* Create a particle
	*/
	particle = xmlSchemaAddParticle(ctxt, node, min, max);
	if (particle == NULL)
	    return (NULL);
	particle->children = (xmlSchemaTreeItemPtr) item;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    }

    /*
    * Extract and validate attributes.
    */
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (type == XML_SCHEMA_TYPE_ALL) {
	xmlSchemaParticlePtr part, last = NULL;

	while (IS_SCHEMA(child, "element")) {
	    part = (xmlSchemaParticlePtr) xmlSchemaParseElement(ctxt,
		schema, child, &isElemRef, 0);
	    /*
	    * SPEC cos-all-limited (2)
	    * "The {max occurs} of all the particles in the {particles}
	    * of the ('all') group must be 0 or 1.
	    */
	    if (part != NULL) {
		if (isElemRef)
		    hasRefs++;
		if (part->minOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for minOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->minOccurs = 1;
		}
		if (part->maxOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for maxOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->maxOccurs = 1;
		}
		if (last == NULL)
		    item->children = (xmlSchemaTreeItemPtr) part;
		else
		    last->next = (xmlSchemaTreeItemPtr) part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (annotation?, element*)");
	}
    } else {
	/* choice + sequence */
	xmlSchemaTreeItemPtr part = NULL, last = NULL;

	while ((IS_SCHEMA(child, "element")) ||
	    (IS_SCHEMA(child, "group")) ||
	    (IS_SCHEMA(child, "any")) ||
	    (IS_SCHEMA(child, "choice")) ||
	    (IS_SCHEMA(child, "sequence"))) {

	    if (IS_SCHEMA(child, "element")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseElement(ctxt, schema, child, &isElemRef, 0);
		if (part && isElemRef)
		    hasRefs++;
	    } else if (IS_SCHEMA(child, "group")) {
		part =
		    xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
		if (part != NULL)
		    hasRefs++;
		/*
		* Handle redefinitions.
		*/
		if (ctxt->isRedefine && ctxt->redef &&
		    (ctxt->redef->item->type == XML_SCHEMA_TYPE_GROUP) &&
		    part && part->children)
		{
		    if ((xmlSchemaGetQNameRefName(part->children) ==
			    ctxt->redef->refName) &&
			(xmlSchemaGetQNameRefTargetNs(part->children) ==
			    ctxt->redef->refTargetNs))
		    {
			/*
			* SPEC src-redefine:
			* (6.1) "If it has a <group> among its contents at
			* some level the `actual value` of whose ref
			* [attribute] is the same as the `actual value` of
			* its own name attribute plus target namespace, then
			* all of the following must be true:"
			* (6.1.1) "It must have exactly one such group."
			*/
			if (ctxt->redefCounter != 0) {
			    xmlChar *str = NULL;

			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain more than one "
				"reference to the redefined definition",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			} else if (((WXS_PARTICLE(part))->minOccurs != 1) ||
			    ((WXS_PARTICLE(part))->maxOccurs != 1))
			{
			    xmlChar *str = NULL;
			    /*
			    * SPEC src-redefine:
			    * (6.1.2) "The `actual value` of both that
			    * group's minOccurs and maxOccurs [attribute]
			    * must be 1 (or `absent`).
			    */
			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain a reference to the "
				"redefined definition with a "
				"maxOccurs/minOccurs other than 1",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			}
			ctxt->redef->reference = WXS_BASIC_CAST part;
			ctxt->redefCounter++;
		    }
		}
	    } else if (IS_SCHEMA(child, "any")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseAny(ctxt, schema, child);
	    } else if (IS_SCHEMA(child, "choice")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
	    } else if (IS_SCHEMA(child, "sequence")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
	    }
	    if (part != NULL) {
		if (last == NULL)
		    item->children = part;
		else
		    last->next = part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (element | group | choice | sequence | any)*)");
	}
    }
    if ((max == 0) && (min == 0))
	return (NULL);
    if (hasRefs) {
	/*
	* We need to resolve references.
	*/
	WXS_ADD_PENDING(ctxt, item);
    }
    if (withParticle)
	return ((xmlSchemaTreeItemPtr) particle);
    else
	return ((xmlSchemaTreeItemPtr) item);
}